

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O0

void __thiscall
ED::ED(ED *this,short *_gradImg,uchar *_dirImg,int _width,int _height,int _gradThresh,
      int _anchorThresh,int _scanInterval,int _minPathLen,bool selectStableAnchors)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_118;
  Point_<int> local_f8;
  int local_f0;
  int local_ec;
  int x;
  int y;
  int i_1;
  int diff2_3;
  int diff1_3;
  int diff2_2;
  int diff1_2;
  int diff2_1;
  int diff1_1;
  int diff2;
  int diff1;
  int j;
  int i;
  Scalar_<double> local_b0;
  Mat local_90 [99];
  byte local_2d;
  int local_2c;
  int iStack_28;
  bool selectStableAnchors_local;
  int _gradThresh_local;
  int _height_local;
  int _width_local;
  uchar *_dirImg_local;
  short *_gradImg_local;
  ED *this_local;
  
  local_2d = selectStableAnchors;
  local_2c = _gradThresh;
  iStack_28 = _height;
  _gradThresh_local = _width;
  __height_local = _dirImg;
  _dirImg_local = (uchar *)_gradImg;
  _gradImg_local = (short *)this;
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::vector(&this->segmentPoints);
  cv::Mat::Mat(&this->smoothImage);
  cv::Mat::Mat(&this->srcImage);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(&this->anchorPoints);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(&this->edgePoints);
  cv::Mat::Mat(&this->edgeImage);
  cv::Mat::Mat(&this->gradImage);
  this->height = iStack_28;
  this->width = _gradThresh_local;
  this->gradThresh = local_2c;
  this->anchorThresh = _anchorThresh;
  this->scanInterval = _scanInterval;
  this->minPathLen = _minPathLen;
  this->gradImg = (short *)_dirImg_local;
  this->dirImg = __height_local;
  iVar1 = this->width;
  iVar2 = this->height;
  cv::Scalar_<double>::Scalar_(&local_b0,0.0);
  cv::Mat::Mat(local_90,iVar2,iVar1,0,(Scalar_ *)&local_b0);
  cv::Mat::operator=(&this->edgeImage,local_90);
  cv::Mat::~Mat(local_90);
  this->edgeImg = *(uchar **)&this->field_0x150;
  if ((local_2d & 1) == 0) {
    ComputeAnchorPoints(this);
  }
  else {
    this->anchorThresh = 0;
    ComputeAnchorPoints(this);
    this->anchorThresh = _anchorThresh;
    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::clear(&this->anchorPoints);
    for (diff1 = 1; diff1 < this->height + -1; diff1 = diff1 + 1) {
      for (diff2 = 1; diff2 < this->width + -1; diff2 = diff2 + 1) {
        if (this->edgeImg[diff1 * this->width + diff2] == 0xfe) {
          if ((this->edgeImg[diff1 * this->width + diff2 + -1] == '\0') ||
             (this->edgeImg[diff1 * this->width + diff2 + 1] == '\0')) {
            if ((this->edgeImg[(diff1 + -1) * this->width + diff2] == '\0') ||
               (this->edgeImg[(diff1 + 1) * this->width + diff2] == '\0')) {
              if ((this->edgeImg[(diff1 + -1) * this->width + diff2 + -1] == '\0') ||
                 (this->edgeImg[(diff1 + 1) * this->width + diff2 + 1] == '\0')) {
                if ((this->edgeImg[(diff1 + -1) * this->width + diff2 + 1] != '\0') &&
                   (this->edgeImg[(diff1 + 1) * this->width + diff2 + -1] != '\0')) {
                  i_1 = (int)this->gradImg[diff1 * this->width + diff2] -
                        (int)this->gradImg[(diff1 + -1) * this->width + diff2 + -1];
                  y = (int)this->gradImg[diff1 * this->width + diff2] -
                      (int)this->gradImg[(diff1 + 1) * this->width + diff2 + 1];
                  if ((this->anchorThresh <= i_1) && (this->anchorThresh <= y)) {
                    this->edgeImg[diff1 * this->width + diff2] = 0xff;
                  }
                }
              }
              else {
                diff1_3 = (int)this->gradImg[diff1 * this->width + diff2] -
                          (int)this->gradImg[(diff1 + -1) * this->width + diff2 + 1];
                diff2_3 = (int)this->gradImg[diff1 * this->width + diff2] -
                          (int)this->gradImg[(diff1 + 1) * this->width + diff2 + -1];
                if ((this->anchorThresh <= diff1_3) && (this->anchorThresh <= diff2_3)) {
                  this->edgeImg[diff1 * this->width + diff2] = 0xff;
                }
              }
            }
            else {
              diff1_2 = (int)this->gradImg[diff1 * this->width + diff2] -
                        (int)this->gradImg[diff1 * this->width + diff2 + -1];
              diff2_2 = (int)this->gradImg[diff1 * this->width + diff2] -
                        (int)this->gradImg[diff1 * this->width + diff2 + 1];
              if ((this->anchorThresh <= diff1_2) && (this->anchorThresh <= diff2_2)) {
                this->edgeImg[diff1 * this->width + diff2] = 0xff;
              }
            }
          }
          else {
            diff1_1 = (int)this->gradImg[diff1 * this->width + diff2] -
                      (int)this->gradImg[(diff1 + -1) * this->width + diff2];
            diff2_1 = (int)this->gradImg[diff1 * this->width + diff2] -
                      (int)this->gradImg[(diff1 + 1) * this->width + diff2];
            if ((this->anchorThresh <= diff1_1) && (this->anchorThresh <= diff2_1)) {
              this->edgeImg[diff1 * this->width + diff2] = 0xff;
            }
          }
        }
      }
    }
    for (x = 0; x < this->width * this->height; x = x + 1) {
      if (this->edgeImg[x] == 0xfe) {
        this->edgeImg[x] = '\0';
      }
      else if (this->edgeImg[x] == 0xff) {
        this->edgeImg[x] = 0xfe;
        local_ec = x / this->width;
        local_f0 = x % this->width;
        cv::Point_<int>::Point_(&local_f8,local_f0,local_ec);
        std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                  (&this->anchorPoints,&local_f8);
      }
    }
    sVar3 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size
                      (&this->anchorPoints);
    this->anchorNos = (int)sVar3;
  }
  this->segmentNos = 0;
  local_118.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(&local_118);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::push_back(&this->segmentPoints,&local_118);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector(&local_118);
  JoinAnchorPointsUsingSortedAnchors(this);
  return;
}

Assistant:

ED::ED(short *_gradImg, uchar *_dirImg, int _width, int _height, int _gradThresh, int _anchorThresh, int _scanInterval, int _minPathLen, bool selectStableAnchors)
{
	height = _height;
	width = _width;

	gradThresh = _gradThresh;
	anchorThresh = _anchorThresh;
	scanInterval = _scanInterval;
	minPathLen = _minPathLen;

	gradImg = _gradImg;
	dirImg = _dirImg;

	edgeImage = Mat(height, width, CV_8UC1, Scalar(0)); // initialize edge Image

	edgeImg = edgeImage.data;

	if (selectStableAnchors) {

		// Compute anchors with the user supplied parameters
		anchorThresh = 0; // anchorThresh used as zero while computing anchor points if selectStableAnchors set. 
						  // Finding higher number of anchors is OK, because we have following validation steps in selectStableAnchors.
		ComputeAnchorPoints();
		anchorThresh = _anchorThresh; // set it to its initial argument value for further anchor validation.
		anchorPoints.clear(); // considering validation step below, it should constructed again.

		for (int i = 1; i<height - 1; i++) {
			for (int j = 1; j<width - 1; j++) {
				if (edgeImg[i*width + j] != ANCHOR_PIXEL) continue;

				// Take only "stable" anchors
				// 0 degree edge
				if (edgeImg[i*width + j - 1] && edgeImg[i*width + j + 1]) {
					int diff1 = gradImg[i*width + j] - gradImg[(i - 1)*width + j];
					int diff2 = gradImg[i*width + j] - gradImg[(i + 1)*width + j];
					if (diff1 >= anchorThresh && diff2 >= anchorThresh) edgeImg[i*width + j] = 255;

					continue;
				} //end-if

				  // 90 degree edge
				if (edgeImg[(i - 1)*width + j] && edgeImg[(i + 1)*width + j]) {
					int diff1 = gradImg[i*width + j] - gradImg[i*width + j - 1];
					int diff2 = gradImg[i*width + j] - gradImg[i*width + j + 1];
					if (diff1 >= anchorThresh && diff2 >= anchorThresh) edgeImg[i*width + j] = 255;

					continue;
				} //end-if

				  // 135 degree diagonal
				if (edgeImg[(i - 1)*width + j - 1] && edgeImg[(i + 1)*width + j + 1]) {
					int diff1 = gradImg[i*width + j] - gradImg[(i - 1)*width + j + 1];
					int diff2 = gradImg[i*width + j] - gradImg[(i + 1)*width + j - 1];
					if (diff1 >= anchorThresh && diff2 >= anchorThresh) edgeImg[i*width + j] = 255;
					continue;
				} //end-if

				  // 45 degree diagonal
				if (edgeImg[(i - 1)*width + j + 1] && edgeImg[(i + 1)*width + j - 1]) {
					int diff1 = gradImg[i*width + j] - gradImg[(i - 1)*width + j - 1];
					int diff2 = gradImg[i*width + j] - gradImg[(i + 1)*width + j + 1];
					if (diff1 >= anchorThresh && diff2 >= anchorThresh) edgeImg[i*width + j] = 255;
				} //end-if

			} //end-for
		} //end-for

		for (int i = 0; i<width*height; i++) 
			if (edgeImg[i] == ANCHOR_PIXEL) 
				edgeImg[i] = 0; 
			else if (edgeImg[i] == 255) {
				edgeImg[i] = ANCHOR_PIXEL;
				int y = i / width;
				int x = i % width;
				anchorPoints.push_back(Point(x, y)); // push validated anchor point to vector
			}
			
		anchorNos = (int)anchorPoints.size(); // get # of anchor pixels
	}

	else {
		// Compute anchors with the user supplied parameters
		ComputeAnchorPoints(); // anchorThresh used as given as argument. No validation applied. (No stable anchors.)
	} //end-else

	segmentNos = 0;
	segmentPoints.push_back(vector<Point>()); // create empty vector of points for segments

	JoinAnchorPointsUsingSortedAnchors();
}